

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O2

AssertionResult __thiscall
testing::internal::EqFailure
          (internal *this,char *expected_expression,char *actual_expression,string *expected_value,
          string *actual_value,bool ignoring_case)

{
  bool bVar1;
  AssertionResult *other;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  extraout_RDX;
  AssertionResult AVar2;
  Message msg;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  char *local_48;
  char *local_40;
  AssertionResult local_38;
  
  local_48 = actual_expression;
  local_40 = expected_expression;
  Message::Message((Message *)&local_50);
  std::operator<<((ostream *)(local_50.ptr_ + 0x10),"Value of: ");
  Message::operator<<((Message *)&local_50,&local_48);
  bVar1 = std::operator!=(actual_value,local_48);
  if (bVar1) {
    std::operator<<((ostream *)(local_50.ptr_ + 0x10),"\n  Actual: ");
    std::operator<<((ostream *)(local_50.ptr_ + 0x10),(string *)actual_value);
  }
  std::operator<<((ostream *)(local_50.ptr_ + 0x10),"\nExpected: ");
  Message::operator<<((Message *)&local_50,&local_40);
  if (ignoring_case) {
    std::operator<<((ostream *)(local_50.ptr_ + 0x10)," (ignoring case)");
  }
  bVar1 = std::operator!=(expected_value,local_40);
  if (bVar1) {
    std::operator<<((ostream *)(local_50.ptr_ + 0x10),"\nWhich is: ");
    std::operator<<((ostream *)(local_50.ptr_ + 0x10),(string *)expected_value);
  }
  local_38.success_ = false;
  local_38.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  other = AssertionResult::operator<<(&local_38,(Message *)&local_50);
  AssertionResult::AssertionResult((AssertionResult *)this,other);
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&local_38.message_);
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&local_50);
  AVar2.message_.ptr_ = extraout_RDX.ptr_;
  AVar2._0_8_ = this;
  return AVar2;
}

Assistant:

AssertionResult EqFailure(const char* expected_expression,
                          const char* actual_expression,
                          const std::string& expected_value,
                          const std::string& actual_value,
                          bool ignoring_case) {
  Message msg;
  msg << "Value of: " << actual_expression;
  if (actual_value != actual_expression) {
    msg << "\n  Actual: " << actual_value;
  }

  msg << "\nExpected: " << expected_expression;
  if (ignoring_case) {
    msg << " (ignoring case)";
  }
  if (expected_value != expected_expression) {
    msg << "\nWhich is: " << expected_value;
  }

  return AssertionFailure() << msg;
}